

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_vector.h
# Opt level: O1

void __thiscall
crnlib::vector<crnlib::dxt_hc::color_cluster>::~vector(vector<crnlib::dxt_hc::color_cluster> *this)

{
  color_quad<unsigned_char,_int> *p;
  void *p_00;
  long lVar1;
  color_cluster *pcVar2;
  color_cluster *pcVar3;
  
  pcVar2 = this->m_p;
  if (pcVar2 != (color_cluster *)0x0) {
    if ((ulong)this->m_size != 0) {
      pcVar3 = pcVar2 + this->m_size;
      do {
        p = (pcVar2->pixels).m_p;
        if (p != (color_quad<unsigned_char,_int> *)0x0) {
          crnlib_free(p);
        }
        lVar1 = 0x30;
        do {
          p_00 = *(void **)((long)(pcVar2->blocks + -1) + lVar1);
          if (p_00 != (void *)0x0) {
            crnlib_free(p_00);
          }
          lVar1 = lVar1 + -0x10;
        } while (lVar1 != 0);
        pcVar2 = pcVar2 + 1;
      } while (pcVar2 != pcVar3);
    }
    crnlib_free(this->m_p);
  }
  return;
}

Assistant:

inline ~vector() {
    if (m_p) {
      scalar_type<T>::destruct_array(m_p, m_size);
      crnlib_free(m_p);
    }
  }